

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkSamplerMipmapMode Diligent::FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)

{
  uint uVar1;
  Char *pCVar2;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  FILTER_TYPE FilterType_local;
  
  uVar1 = (uint)FilterType;
  msg.field_2._M_local_buf[0xb] = FilterType;
  if (uVar1 == 0) {
    FormatString<char[20]>((string *)local_30,(char (*) [20])"Unknown filter type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FilterTypeToVkMipmapMode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x47c);
    std::__cxx11::string::~string((string *)local_30);
    return VK_SAMPLER_MIPMAP_MODE_NEAREST;
  }
  if (uVar1 == 1) {
LAB_00399e5a:
    msg.field_2._12_4_ = 0;
  }
  else {
    if (1 < uVar1 - 2) {
      if (uVar1 == 4) goto LAB_00399e5a;
      if (1 < uVar1 - 5) {
        if (uVar1 == 7) goto LAB_00399e5a;
        if (1 < uVar1 - 8) {
          if (uVar1 == 10) goto LAB_00399e5a;
          if (1 < uVar1 - 0xb) {
            FormatString<char[63]>
                      ((string *)local_60,
                       (char (*) [63])
                       "Only point and linear filter types are allowed for mipmap mode");
            pCVar2 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar2,"FilterTypeToVkMipmapMode",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                       ,0x490);
            std::__cxx11::string::~string((string *)local_60);
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;
          }
        }
      }
    }
    msg.field_2._12_4_ = 1;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkSamplerMipmapMode FilterTypeToVkMipmapMode(FILTER_TYPE FilterType)
{
    switch (FilterType)
    {
        case FILTER_TYPE_UNKNOWN:
            UNEXPECTED("Unknown filter type");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_POINT:
        case FILTER_TYPE_COMPARISON_POINT:
        case FILTER_TYPE_MINIMUM_POINT:
        case FILTER_TYPE_MAXIMUM_POINT:
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;

        case FILTER_TYPE_LINEAR:
        case FILTER_TYPE_ANISOTROPIC:
        case FILTER_TYPE_COMPARISON_LINEAR:
        case FILTER_TYPE_COMPARISON_ANISOTROPIC:
        case FILTER_TYPE_MINIMUM_LINEAR:
        case FILTER_TYPE_MINIMUM_ANISOTROPIC:
        case FILTER_TYPE_MAXIMUM_LINEAR:
        case FILTER_TYPE_MAXIMUM_ANISOTROPIC:
            return VK_SAMPLER_MIPMAP_MODE_LINEAR;

        default:
            UNEXPECTED("Only point and linear filter types are allowed for mipmap mode");
            return VK_SAMPLER_MIPMAP_MODE_NEAREST;
    }
}